

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

xmlHashedString htmlParseAttribute(htmlParserCtxtPtr ctxt,xmlChar **value)

{
  xmlHashedString xVar1;
  xmlChar *local_30;
  xmlChar *val;
  xmlChar **value_local;
  htmlParserCtxtPtr ctxt_local;
  xmlHashedString hname;
  
  local_30 = (xmlChar *)0x0;
  *value = (xmlChar *)0x0;
  xVar1 = htmlParseHTMLName(ctxt,1);
  if (xVar1.name != (xmlChar *)0x0) {
    htmlSkipBlankChars(ctxt);
    if (*ctxt->input->cur == '=') {
      ctxt->input->cur = ctxt->input->cur + 1;
      ctxt->input->col = ctxt->input->col + 1;
      htmlSkipBlankChars(ctxt);
      local_30 = htmlParseAttValue(ctxt);
    }
    *value = local_30;
  }
  xVar1._4_4_ = 0;
  return xVar1;
}

Assistant:

static xmlHashedString
htmlParseAttribute(htmlParserCtxtPtr ctxt, xmlChar **value) {
    xmlHashedString hname;
    xmlChar *val = NULL;

    *value = NULL;
    hname = htmlParseHTMLName(ctxt, 1);
    if (hname.name == NULL)
        return(hname);

    /*
     * read the value
     */
    SKIP_BLANKS;
    if (CUR == '=') {
        SKIP(1);
	SKIP_BLANKS;
	val = htmlParseAttValue(ctxt);
    }

    *value = val;
    return(hname);
}